

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulg uVar6;
  int iVar7;
  uint uVar8;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  
  if (s->last_lit == 0) {
    iVar7 = s->bi_valid;
  }
  else {
    uVar10 = 0;
    do {
      uVar3 = s->d_buf[uVar10];
      bVar1 = s->l_buf[uVar10];
      if (uVar3 == 0) {
        uVar3 = ltree[bVar1].dl.dad;
        iVar7 = s->bi_valid;
        uVar4 = ltree[bVar1].fc.freq;
        uVar9 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar9;
        if ((int)(0x10 - (uint)uVar3) < iVar7) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar7 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar7 = iVar7 + (uint)uVar3;
        }
LAB_00294a77:
        s->bi_valid = iVar7;
      }
      else {
        uVar11 = (ulong)""[bVar1];
        uVar4 = ltree[uVar11 + 0x101].dl.dad;
        iVar7 = s->bi_valid;
        uVar9 = ltree[uVar11 + 0x101].fc.freq;
        uVar12 = uVar9 << ((byte)iVar7 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar12;
        if ((int)(0x10 - (uint)uVar4) < iVar7) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar12;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          uVar12 = uVar9 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar12;
          iVar7 = (uint)uVar4 + s->bi_valid + -0x10;
        }
        else {
          iVar7 = iVar7 + (uint)uVar4;
        }
        uVar13 = (uint)uVar12;
        s->bi_valid = iVar7;
        if (0xffffffffffffffeb < uVar11 - 0x1c) {
          uVar14 = (uint)bVar1 - base_length[uVar11];
          iVar5 = extra_lbits[uVar11];
          if (0x10 - iVar5 < iVar7) {
            uVar13 = uVar13 | uVar14 << ((byte)iVar7 & 0x1f);
            s->bi_buf = (ush)uVar13;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (Bytef)uVar13;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = BVar2;
            uVar13 = (uVar14 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f);
            s->bi_buf = (ush)uVar13;
            iVar7 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            uVar13 = uVar13 | uVar14 << ((byte)iVar7 & 0x1f);
            s->bi_buf = (ush)uVar13;
            iVar7 = iVar5 + iVar7;
          }
          s->bi_valid = iVar7;
        }
        uVar8 = uVar3 - 1;
        uVar14 = (uVar8 >> 7) + 0x100;
        if (uVar3 < 0x101) {
          uVar14 = uVar8;
        }
        bVar1 = ""[uVar14];
        uVar3 = dtree[bVar1].dl.dad;
        uVar4 = dtree[bVar1].fc.freq;
        uVar13 = uVar13 | (uint)uVar4 << ((byte)iVar7 & 0x1f);
        s->bi_buf = (ush)uVar13;
        if ((int)(0x10 - (uint)uVar3) < iVar7) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar13;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          uVar4 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar4;
          iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
          uVar13 = (uint)uVar4;
        }
        else {
          iVar7 = iVar7 + (uint)uVar3;
        }
        s->bi_valid = iVar7;
        if (3 < bVar1) {
          uVar8 = uVar8 - base_dist[bVar1];
          iVar5 = extra_dbits[bVar1];
          if (0x10 - iVar5 < iVar7) {
            uVar13 = uVar13 | uVar8 << ((byte)iVar7 & 0x1f);
            s->bi_buf = (ush)uVar13;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (Bytef)uVar13;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = BVar2;
            s->bi_buf = (ush)((uVar8 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar7 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = (ushort)uVar13 | (ushort)(uVar8 << ((byte)iVar7 & 0x1f));
            iVar7 = iVar5 + iVar7;
          }
          goto LAB_00294a77;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < s->last_lit);
  }
  uVar3 = ltree[0x100].dl.dad;
  uVar4 = ltree[0x100].fc.freq;
  uVar9 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar9;
  if ((int)(0x10 - (uint)uVar3) < iVar7) {
    uVar6 = s->pending;
    s->pending = uVar6 + 1;
    s->pending_buf[uVar6] = (Bytef)uVar9;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar6 = s->pending;
    s->pending = uVar6 + 1;
    s->pending_buf[uVar6] = BVar2;
    s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar7 = (uint)uVar3 + s->bi_valid + -0x10;
  }
  else {
    iVar7 = iVar7 + (uint)uVar3;
  }
  s->bi_valid = iVar7;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    const ct_data *ltree; /* literal tree */
    const ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
}